

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O0

REF_STATUS
ref_fortran_init_(REF_INT *nnodes,REF_GLOB *nnodesg,REF_GLOB *l2g,REF_INT *part,REF_INT *partition,
                 REF_DBL *x,REF_DBL *y,REF_DBL *z)

{
  uint uVar1;
  long lVar2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pos;
  REF_INT node;
  REF_NODE ref_node;
  REF_DBL *x_local;
  REF_INT *partition_local;
  REF_INT *part_local;
  REF_GLOB *l2g_local;
  REF_GLOB *nnodesg_local;
  REF_INT *nnodes_local;
  
  ref_node = (REF_NODE)x;
  x_local = (REF_DBL *)partition;
  partition_local = part;
  part_local = (REF_INT *)l2g;
  l2g_local = nnodesg;
  nnodesg_local = (REF_GLOB *)nnodes;
  uVar1 = ref_mpi_create(&ref_mpi);
  if (uVar1 == 0) {
    uVar1 = ref_grid_create(&ref_grid,ref_mpi);
    if (uVar1 == 0) {
      _pos = ref_grid->node;
      ref_mpi_stopwatch_start(ref_grid->mpi);
      lVar2 = (long)ref_grid->mpi->id;
      if (*(int *)x_local == lVar2) {
        uVar1 = ref_node_initialize_n_global(_pos,*l2g_local);
        if (uVar1 == 0) {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < (int)*nnodesg_local;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            uVar1 = ref_node_add(_pos,*(long *)(part_local + (long)ref_private_macro_code_rss * 2) +
                                      -1,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                     ,0x3d,"ref_fortran_init_",(ulong)uVar1,"add node");
              return uVar1;
            }
            _pos->real[ref_private_macro_code_rss_1 * 0xf] =
                 *(REF_DBL *)(&ref_node->n + (long)ref_private_macro_code_rss * 2);
            _pos->real[ref_private_macro_code_rss_1 * 0xf + 1] = y[ref_private_macro_code_rss];
            _pos->real[ref_private_macro_code_rss_1 * 0xf + 2] = z[ref_private_macro_code_rss];
            _pos->part[ref_private_macro_code_rss_1] =
                 partition_local[ref_private_macro_code_rss] + -1;
          }
          nnodes_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                 ,0x3a,"ref_fortran_init_",(ulong)uVar1,"init nnodesg");
          nnodes_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x38,"ref_fortran_init_","processor ids do not match",(long)*(int *)x_local,lVar2);
        nnodes_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x32,"ref_fortran_init_",(ulong)uVar1,"create grid");
      nnodes_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",0x31,
           "ref_fortran_init_",(ulong)uVar1,"create mpi");
    nnodes_local._4_4_ = uVar1;
  }
  return nnodes_local._4_4_;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_init,
                     REF_FORTRAN_INIT)(REF_INT *nnodes, REF_GLOB *nnodesg,
                                       REF_GLOB *l2g, REF_INT *part,
                                       REF_INT *partition, REF_DBL *x,
                                       REF_DBL *y, REF_DBL *z) {
  REF_NODE ref_node;
  REF_INT node, pos;
  RSS(ref_mpi_create(&ref_mpi), "create mpi");
  RSS(ref_grid_create(&ref_grid, ref_mpi), "create grid");
  ref_node = ref_grid_node(ref_grid);

  ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  REIS(*partition, ref_mpi_rank(ref_grid_mpi(ref_grid)),
       "processor ids do not match");

  RSS(ref_node_initialize_n_global(ref_node, *nnodesg), "init nnodesg");

  for (node = 0; node < (*nnodes); node++) {
    RSS(ref_node_add(ref_node, l2g[node] - 1, &pos), "add node");
    ref_node_xyz(ref_node, 0, pos) = x[node];
    ref_node_xyz(ref_node, 1, pos) = y[node];
    ref_node_xyz(ref_node, 2, pos) = z[node];
    ref_node_part(ref_node, pos) = part[node] - 1;
  }

  return REF_SUCCESS;
}